

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assembler.cpp
# Opt level: O2

string * Assembler::rType(string *__return_storage_ptr__,string *operation,int line)

{
  bool bVar1;
  uint uVar2;
  int ext;
  string *this;
  string sStack_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  string func;
  string shift;
  string rt;
  string rd;
  string rs;
  string opcode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"(\\s|,)+",(allocator *)&opcode);
  HelpFuncts::split(&v,operation,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string
            ((string *)&local_50,
             (string *)
             v.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  AsmFuncts::getOpCode(&opcode,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  rs._M_dataplus._M_p = (pointer)&rs.field_2;
  rs._M_string_length = 0;
  ext = 0;
  rd._M_dataplus._M_p = (pointer)&rd.field_2;
  rd._M_string_length = 0;
  rt._M_dataplus._M_p = (pointer)&rt.field_2;
  rt._M_string_length = 0;
  rs.field_2._M_local_buf[0] = '\0';
  rd.field_2._M_local_buf[0] = '\0';
  shift._M_dataplus._M_p = (pointer)&shift.field_2;
  shift._M_string_length = 0;
  func._M_dataplus._M_p = (pointer)&func.field_2;
  func._M_string_length = 0;
  rt.field_2._M_local_buf[0] = '\0';
  shift.field_2._M_local_buf[0] = '\0';
  func.field_2._M_local_buf[0] = '\0';
  bVar1 = std::operator==(v.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,"sll");
  if (!bVar1) {
    bVar1 = std::operator==(v.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,"srl");
    if (!bVar1) {
      std::__cxx11::string::string
                ((string *)&local_d0,
                 (string *)
                 (v.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 2));
      AsmFuncts::getRegCode(&sStack_288,&local_d0);
      std::__cxx11::string::operator=((string *)&rs,(string *)&sStack_288);
      std::__cxx11::string::~string((string *)&sStack_288);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::string
                ((string *)&local_f0,
                 (string *)
                 (v.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 3));
      AsmFuncts::getRegCode(&sStack_288,&local_f0);
      std::__cxx11::string::operator=((string *)&rt,(string *)&sStack_288);
      std::__cxx11::string::~string((string *)&sStack_288);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::string
                ((string *)&local_110,
                 (string *)
                 (v.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1));
      AsmFuncts::getRegCode(&sStack_288,&local_110);
      std::__cxx11::string::operator=((string *)&rd,(string *)&sStack_288);
      std::__cxx11::string::~string((string *)&sStack_288);
      std::__cxx11::string::~string((string *)&local_110);
      Conversion::decToBin_abi_cxx11_(&sStack_288,(Conversion *)0x0,5,ext);
      std::__cxx11::string::operator=((string *)&shift,(string *)&sStack_288);
      std::__cxx11::string::~string((string *)&sStack_288);
      std::__cxx11::string::string
                ((string *)&local_130,
                 (string *)
                 v.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      AsmFuncts::getFuncCode(&sStack_288,&local_130);
      std::__cxx11::string::operator=((string *)&func,(string *)&sStack_288);
      std::__cxx11::string::~string((string *)&sStack_288);
      this = &local_130;
      goto LAB_0011ed67;
    }
  }
  Conversion::decToBin_abi_cxx11_(&sStack_288,(Conversion *)0x0,5,ext);
  std::__cxx11::string::operator=((string *)&rs,(string *)&sStack_288);
  std::__cxx11::string::~string((string *)&sStack_288);
  std::__cxx11::string::string
            ((string *)&local_70,
             (string *)
             (v.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 2));
  AsmFuncts::getRegCode(&sStack_288,&local_70);
  std::__cxx11::string::operator=((string *)&rt,(string *)&sStack_288);
  std::__cxx11::string::~string((string *)&sStack_288);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string
            ((string *)&local_90,
             (string *)
             (v.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1));
  AsmFuncts::getRegCode(&sStack_288,&local_90);
  std::__cxx11::string::operator=((string *)&rd,(string *)&sStack_288);
  std::__cxx11::string::~string((string *)&sStack_288);
  std::__cxx11::string::~string((string *)&local_90);
  uVar2 = std::__cxx11::stoi(v.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 3,(size_t *)0x0,10);
  Conversion::decToBin_abi_cxx11_(&sStack_288,(Conversion *)(ulong)uVar2,5,ext);
  std::__cxx11::string::operator=((string *)&shift,(string *)&sStack_288);
  std::__cxx11::string::~string((string *)&sStack_288);
  std::__cxx11::string::string
            ((string *)&local_b0,
             (string *)
             v.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  AsmFuncts::getFuncCode(&sStack_288,&local_b0);
  std::__cxx11::string::operator=((string *)&func,(string *)&sStack_288);
  std::__cxx11::string::~string((string *)&sStack_288);
  this = &local_b0;
LAB_0011ed67:
  std::__cxx11::string::~string((string *)this);
  std::operator+(&local_190,&opcode,&rs);
  std::operator+(&local_170,&local_190,&rt);
  std::operator+(&local_150,&local_170,&rd);
  std::operator+(&sStack_288,&local_150,&shift);
  std::operator+(__return_storage_ptr__,&sStack_288,&func);
  std::__cxx11::string::~string((string *)&sStack_288);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&func);
  std::__cxx11::string::~string((string *)&shift);
  std::__cxx11::string::~string((string *)&rt);
  std::__cxx11::string::~string((string *)&rd);
  std::__cxx11::string::~string((string *)&rs);
  std::__cxx11::string::~string((string *)&opcode);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v);
  return __return_storage_ptr__;
}

Assistant:

string Assembler::rType(string operation, int line){
    vector<string> v = HelpFuncts::split(operation,"(\\s|,)+");
    string opcode = AsmFuncts::getOpCode(v[0]);
    string rs,rd,rt,shift,func;
    if((v[0] == "sll") || (v[0] == "srl")){
        rs = Conversion::decToBin(0,5);
        rt = AsmFuncts::getRegCode(v[2]);
        rd = AsmFuncts::getRegCode(v[1]);
        shift = Conversion::decToBin(stoi(v[3]),5);
        func = AsmFuncts::getFuncCode(v[0]);
    }else{
        rs = AsmFuncts::getRegCode(v[2]);
        rt = AsmFuncts::getRegCode(v[3]);
        rd = AsmFuncts::getRegCode(v[1]);
        shift = Conversion::decToBin(0,5);
        func = AsmFuncts::getFuncCode(v[0]);
    }
    return (opcode + rs + rt + rd + shift + func);
}